

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::CommandCompare::compareDFDBasic
          (CommandCompare *this,PrintDiff *diff,uint32_t blockIndex,optional<ktx::BDFD> *bdfds,
          optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *bdfdSamples)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  void *pvVar7;
  code *pcVar8;
  long lVar9;
  pointer pcVar10;
  bool *pbVar11;
  pointer pcVar12;
  optional<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_> *poVar13;
  uint uVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  undefined8 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar19;
  char *pcVar20;
  _Alloc_hider _Var21;
  optional<std::__cxx11::string> *this_00;
  bool bVar22;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  string_view fmt_12;
  string_view fmt_13;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  string_view textHeaderIn;
  string_view textHeaderIn_00;
  string_view textHeaderIn_01;
  string_view textHeaderIn_02;
  string_view textHeaderIn_03;
  string_view textHeaderIn_04;
  string_view textHeaderIn_05;
  string_view jsonPathIn;
  string_view jsonPathIn_00;
  string_view jsonPathIn_01;
  string_view jsonPathIn_02;
  string_view jsonPathIn_03;
  string_view jsonPathIn_04;
  string_view jsonPathIn_05;
  _Storage<int,_true> local_1a8;
  bool bStack_1a4;
  undefined3 uStack_1a3;
  bool local_1a0;
  undefined3 uStack_19f;
  undefined4 uStack_19c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  optional<ktx::SampleType> samples [2];
  optional<ktx::BDFD> *bdfds_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  lengthAndOffset [2];
  _Alloc_hider local_100;
  undefined1 local_f8 [64];
  code *local_b8;
  undefined1 local_9c [16];
  bool local_8c;
  CommandCompare *local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  _Storage<int,_true> local_60;
  undefined1 local_5c;
  optional<unsigned_int> qualifierFlags [2];
  uint extraout_EDX;
  string *__return_storage_ptr__;
  
  aVar17.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1a8;
  aVar18.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1a8;
  aVar19.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1a8;
  pbVar11 = &(bdfds->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged;
  lVar9 = 0x18;
  do {
    bdfds_local = bdfds;
    local_88 = this;
    if (*pbVar11 !=
        (bool)*(char *)((long)&(bdfdSamples->
                               super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                               ._M_payload + lVar9)) {
      __assert_fail("bdfds[i].has_value() == bdfdSamples[i].has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp"
                    ,0x691,
                    "void ktx::CommandCompare::compareDFDBasic(PrintDiff &, uint32_t, std::optional<BDFD> *, std::optional<std::vector<SampleType>> *)"
                   );
    }
    lVar9 = lVar9 + 0x20;
    pbVar11 = pbVar11 + 0x1c;
  } while (lVar9 == 0x38);
  pcVar10 = (pointer)(ulong)blockIndex;
  if ((this->options).super_OptionsCompare.ignoreDFD != all_except_color_space) {
    __return_storage_ptr__ = (string *)lengthAndOffset;
    fmt.size_ = 2;
    fmt.data_ = (char *)0x25;
    args.field_1.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)in_R9
    ;
    args.desc_ = (unsigned_long_long)samples;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar10;
    ::fmt::v10::vformat_abi_cxx11_
              (__return_storage_ptr__,(v10 *)"/dataFormatDescriptor/blocks/{}/flags",fmt,args);
    uVar16 = (uint)__return_storage_ptr__;
    bVar22 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged;
    uVar14 = extraout_EDX;
    if (bVar22 == true) {
      uVar14 = (uint)*(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>).
                                      _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload
                              + 0xb);
    }
    bVar2 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::BDFD>._M_engaged;
    if (bVar2 == true) {
      uVar16 = (uint)*(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                      _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload
                              + 0xb);
    }
    local_f8._8_8_ = 5;
    local_f8._16_8_ = (long)"Image{}.imageFlags" + 0xd;
    local_f8._24_8_ =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    local_f8._32_8_ =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p;
    lVar9 = 0x2c;
    do {
      local_f8[lVar9] = 0;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x3c);
    local_f8[0x38] = uVar14 != uVar16 & bVar22 | bVar22 != bVar2;
    local_f8[0x2c] = bVar22;
    local_f8._40_4_ = uVar14;
    local_f8._45_3_ = 0;
    local_f8[0x34] = bVar2;
    local_f8._48_4_ = uVar16;
    local_f8._53_3_ = 0;
    local_f8._0_8_ = &PTR_value_abi_cxx11__0025eaa8;
    local_b8 = dfdToStringFlagsBit;
    in_R9 = lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length;
    PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
    if ((pointer)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_ !=
        (pointer)((long)&lengthAndOffset[0].
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10)) {
      operator_delete((void *)lengthAndOffset[0].
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._0_8_,
                      lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
  }
  fmt_00.size_ = 2;
  fmt_00.data_ = &DAT_00000030;
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)in_R9;
  args_00.desc_ = (unsigned_long_long)samples;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar10;
  ::fmt::v10::vformat_abi_cxx11_
            ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/transferFunction",
             fmt_00,args_00);
  uVar3 = _local_1a8;
  bVar22 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
           super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
  if (bVar22) {
    local_1a8._M_value._1_3_ = 0;
    local_1a8._M_value._0_1_ =
         *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                          super__Optional_payload_base<ktx::BDFD>._M_payload + 10);
    _bStack_1a4 = SUB84(uVar3,4);
  }
  bStack_1a4 = bVar22;
  bVar22 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
           super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
  if (bVar22) {
    local_9c._1_3_ = 0;
    local_9c[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload +
                           10);
  }
  local_9c[4] = bVar22;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x135a7a;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x135a;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
  textHeaderIn._M_str = "Transfer";
  textHeaderIn._M_len = 8;
  jsonPathIn._M_str =
       (char *)lengthAndOffset[0].
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._0_8_;
  jsonPathIn._M_len =
       lengthAndOffset[0].
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length;
  DiffEnum<_khr_df_transfer_e>::DiffEnum
            ((DiffEnum<_khr_df_transfer_e> *)local_f8,textHeaderIn,jsonPathIn,
             (optional<int> *)&local_1a8,(optional<int> *)local_9c,
             (function<const_char_*(unsigned_long)> *)samples);
  PrintDiff::operator<<(diff,(DiffBase<_khr_df_transfer_e> *)local_f8);
  pcVar8 = (code *)CONCAT17(samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                            super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_,
                            CONCAT16(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._2_1_,
                                     CONCAT24(samples[1].
                                              super__Optional_base<ktx::SampleType,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<ktx::SampleType>.
                                              _M_payload._0_2_,
                                              samples[0].
                                              super__Optional_base<ktx::SampleType,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<ktx::SampleType>._16_4_))
                           );
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(samples,samples,3);
  }
  _Var15._M_p = (pointer)((long)&lengthAndOffset[0].
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload + 0x10);
  if ((pointer)lengthAndOffset[0].
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._0_8_ != _Var15._M_p) {
    operator_delete((void *)lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._0_8_,
                    lengthAndOffset[0].
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  fmt_01.size_ = 2;
  fmt_01.data_ = (char *)0x2e;
  args_01.field_1.values_ = aVar17.values_;
  args_01.desc_ = (unsigned_long_long)samples;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = pcVar10;
  ::fmt::v10::vformat_abi_cxx11_
            ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/colorPrimaries",
             fmt_01,args_01);
  uVar3 = _local_1a8;
  bVar22 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
           super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
  if (bVar22) {
    local_1a8._M_value._1_3_ = 0;
    local_1a8._M_value._0_1_ =
         *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                          super__Optional_payload_base<ktx::BDFD>._M_payload + 9);
    _bStack_1a4 = SUB84(uVar3,4);
  }
  bStack_1a4 = bVar22;
  bVar22 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
           super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
  if (bVar22) {
    local_9c._1_3_ = 0;
    local_9c[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload + 9
                           );
  }
  local_9c[4] = bVar22;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x135abe;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
  samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x135a;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
  samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
  super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
  textHeaderIn_00._M_str = "Primaries";
  textHeaderIn_00._M_len = 9;
  jsonPathIn_00._M_str =
       (char *)lengthAndOffset[0].
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._0_8_;
  jsonPathIn_00._M_len =
       lengthAndOffset[0].
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._M_value._M_string_length;
  DiffEnum<_khr_df_primaries_e>::DiffEnum
            ((DiffEnum<_khr_df_primaries_e> *)local_f8,textHeaderIn_00,jsonPathIn_00,
             (optional<int> *)&local_1a8,(optional<int> *)local_9c,
             (function<const_char_*(unsigned_long)> *)samples);
  PrintDiff::operator<<(diff,(DiffBase<_khr_df_primaries_e> *)local_f8);
  pcVar8 = (code *)CONCAT17(samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                            super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_,
                            CONCAT16(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._2_1_,
                                     CONCAT24(samples[1].
                                              super__Optional_base<ktx::SampleType,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<ktx::SampleType>.
                                              _M_payload._0_2_,
                                              samples[0].
                                              super__Optional_base<ktx::SampleType,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<ktx::SampleType>._16_4_))
                           );
  local_100._M_p = pcVar10;
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(samples,samples,3);
  }
  if ((pointer)lengthAndOffset[0].
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._0_8_ != _Var15._M_p) {
    operator_delete((void *)lengthAndOffset[0].
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._0_8_,
                    lengthAndOffset[0].
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ + 1);
  }
  _Var21._M_p = local_100._M_p;
  if ((local_88->options).super_OptionsCompare.ignoreDFD != all_except_color_space) {
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = local_100._M_p;
    fmt_02.size_ = 2;
    fmt_02.data_ = (char *)0x2a;
    args_02.field_1.values_ = aVar18.values_;
    args_02.desc_ = (unsigned_long_long)samples;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/colorModel",fmt_02,
               args_02);
    uVar3 = _local_1a8;
    bVar22 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if (bVar22) {
      local_1a8._M_value._1_3_ = 0;
      local_1a8._M_value._0_1_ =
           *(byte *)((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                            super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
      _bStack_1a4 = SUB84(uVar3,4);
    }
    bStack_1a4 = bVar22;
    bVar22 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if (bVar22) {
      local_9c._1_3_ = 0;
      local_9c[0] = *(byte *)((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::BDFD>._M_payload +
                             8);
    }
    local_9c[4] = bVar22;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_ = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = &bdfds_local;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ = 0x135b02;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower = 0;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_engaged = true;
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._17_3_ = 0x135b;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_2_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._2_1_ = 0;
    samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ = 0;
    textHeaderIn_01._M_str = "Model";
    textHeaderIn_01._M_len = 5;
    jsonPathIn_01._M_str =
         (char *)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_;
    jsonPathIn_01._M_len =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    DiffEnum<_khr_df_model_e>::DiffEnum
              ((DiffEnum<_khr_df_model_e> *)local_f8,textHeaderIn_01,jsonPathIn_01,
               (optional<int> *)&local_1a8,(optional<int> *)local_9c,
               (function<const_char_*(unsigned_long)> *)samples);
    PrintDiff::operator<<(diff,(DiffBase<_khr_df_model_e> *)local_f8);
    pcVar8 = (code *)CONCAT17(samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                              _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload.
                              _3_1_,CONCAT16(samples[1].
                                             super__Optional_base<ktx::SampleType,_true,_true>.
                                             _M_payload.
                                             super__Optional_payload_base<ktx::SampleType>.
                                             _M_payload._2_1_,
                                             CONCAT24(samples[1].
                                                                                                            
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _M_payload._0_2_,
                                                  samples[0].
                                                  super__Optional_base<ktx::SampleType,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<ktx::SampleType>.
                                                  _16_4_)));
    if (pcVar8 != (code *)0x0) {
      (*pcVar8)(samples,samples,3);
    }
    if ((pointer)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_ != _Var15._M_p) {
      operator_delete((void *)lengthAndOffset[0].
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._0_8_,
                      lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = _Var21._M_p;
    fmt_03.size_ = 2;
    fmt_03.data_ = (char *)0x33;
    args_03.field_1.values_ = aVar19.values_;
    args_03.desc_ = (unsigned_long_long)samples;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)lengthAndOffset,
               (v10 *)"/dataFormatDescriptor/blocks/{}/texelBlockDimension",fmt_03,args_03);
    bVar22 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
             super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if (bVar22) {
      uVar3 = *(undefined8 *)
               ((long)&(bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
                       super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
      uVar14 = (uint)((ulong)uVar3 >> 0x20);
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ =
           CONCAT44(uVar14 >> 8,uVar14) & 0xff000000ff;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper._1_3_ = 0;
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._8_5_ =
           CONCAT14((char)((ulong)uVar3 >> 0x38),(uint)(ushort)((ulong)uVar3 >> 0x30)) &
           0xff000000ff;
    }
    samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
    super__Optional_payload_base<ktx::SampleType>._M_engaged = bVar22;
    local_198._M_local_buf[0] =
         bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
         super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
    if ((bool)local_198._M_local_buf[0]) {
      uVar3 = *(undefined8 *)
               ((long)&bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::BDFD>._M_payload + 8);
      uVar14 = (uint)((ulong)uVar3 >> 0x20);
      _local_1a0 = (ushort)((ulong)uVar3 >> 0x30) & 0xff;
      _local_1a8 = CONCAT44(uVar14 >> 8,uVar14) & 0xff000000ff;
      uStack_19c = ZEXT14((byte)((ulong)uVar3 >> 0x38));
    }
    pcVar20 = (char *)samples;
    textHeaderIn_02._M_str = "Dimensions";
    textHeaderIn_02._M_len = 10;
    jsonPathIn_02._M_str =
         (char *)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_;
    jsonPathIn_02._M_len =
         lengthAndOffset[0].
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    DiffBase<std::array<unsigned_int,_4UL>_>::DiffBase
              ((DiffBase<std::array<unsigned_int,_4UL>_> *)local_f8,textHeaderIn_02,jsonPathIn_02,
               (optional<std::array<unsigned_int,_4UL>_> *)pcVar20,
               (optional<std::array<unsigned_int,_4UL>_> *)&local_1a8);
    local_f8._0_8_ = &PTR_value_abi_cxx11__0025f450;
    PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_int,_4UL>_> *)local_f8);
    if ((pointer)lengthAndOffset[0].
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._0_8_ != _Var15._M_p) {
      operator_delete((void *)lengthAndOffset[0].
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._0_8_,
                      lengthAndOffset[0].
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ + 1);
    }
    if ((local_88->options).super_OptionsCompare.ignoreBDFDBytesPlane == false) {
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ = _Var21._M_p;
      fmt_04.size_ = 2;
      fmt_04.data_ = (char *)0x2a;
      args_04.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pcVar20;
      args_04.desc_ = (unsigned_long_long)samples;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)lengthAndOffset,(v10 *)"/dataFormatDescriptor/blocks/{}/bytesPlane",
                 fmt_04,args_04);
      bVar22 = (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
               super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if (bVar22) {
        samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
        super__Optional_payload_base<ktx::SampleType>._M_payload._0_8_ =
             *(undefined8 *)
              (bdfds_local->super__Optional_base<ktx::BDFD,_true,_true>)._M_payload.
              super__Optional_payload_base<ktx::BDFD>._M_payload._M_value.bytesPlanes._M_elems;
      }
      samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
      super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower._0_1_ = bVar22;
      bVar22 = bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::BDFD>._M_engaged == true;
      if (bVar22) {
        _local_1a8 = *(undefined8 *)
                      bdfds_local[1].super__Optional_base<ktx::BDFD,_true,_true>._M_payload.
                      super__Optional_payload_base<ktx::BDFD>._M_payload._M_value.bytesPlanes.
                      _M_elems;
      }
      local_1a0 = bVar22;
      pcVar20 = (char *)samples;
      textHeaderIn_03._M_str = "Plane bytes";
      textHeaderIn_03._M_len = 0xb;
      jsonPathIn_03._M_str =
           (char *)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_;
      jsonPathIn_03._M_len =
           lengthAndOffset[0].
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length;
      DiffBase<std::array<unsigned_char,_8UL>_>::DiffBase
                ((DiffBase<std::array<unsigned_char,_8UL>_> *)local_f8,textHeaderIn_03,jsonPathIn_03
                 ,(optional<std::array<unsigned_char,_8UL>_> *)pcVar20,
                 (optional<std::array<unsigned_char,_8UL>_> *)&local_1a8);
      local_f8._0_8_ = &PTR_value_abi_cxx11__0025f4a8;
      PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_char,_8UL>_> *)local_f8);
      if ((pointer)lengthAndOffset[0].
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._0_8_ != _Var15._M_p) {
        operator_delete((void *)lengthAndOffset[0].
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._0_8_,
                        lengthAndOffset[0].
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_ + 1);
      }
    }
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Sample <i>:\n","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((bdfdSamples->
        super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
        ._M_engaged == true) {
      pcVar10 = (pointer)((long)*(pointer *)
                                 ((long)&(bdfdSamples->
                                         super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                         )._M_payload.
                                         super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                         ._M_payload._M_value.
                                         super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                         ._M_impl + 8) -
                          *(long *)&(bdfdSamples->
                                    super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                    )._M_payload.
                                    super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                    ._M_payload._M_value.
                                    super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                    ._M_impl >> 4);
    }
    else {
      pcVar10 = (pointer)0x0;
    }
    if (bdfdSamples[1].
        super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
        ._M_engaged == true) {
      pcVar12 = (pointer)((long)*(pointer *)
                                 ((long)&bdfdSamples[1].
                                         super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                         ._M_payload._M_value.
                                         super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                         ._M_impl + 8) -
                          *(long *)&bdfdSamples[1].
                                    super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                    ._M_payload._M_value.
                                    super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                    ._M_impl >> 4);
    }
    else {
      pcVar12 = (pointer)0x0;
    }
    if (pcVar12 < pcVar10) {
      pcVar12 = pcVar10;
    }
    if (pcVar12 != (pointer)0x0) {
      _Var15._M_p = (pointer)0x0;
      do {
        fmt_05.size_ = 4;
        fmt_05.data_ = (char *)0xb;
        args_05.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pcVar20;
        args_05.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._0_8_ = _Var15._M_p;
        ::fmt::v10::vformat_abi_cxx11_((string *)local_f8,(v10 *)"Sample {}:\n",fmt_05,args_05);
        PrintDiff::updateContext(diff,(string *)local_f8);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        lVar9 = 0x10;
        do {
          *(undefined1 *)
           ((long)&samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::SampleType>._M_payload + lVar9) = 0;
          lVar9 = lVar9 + 0x14;
        } while (lVar9 != 0x38);
        lVar9 = 0x10;
        poVar13 = bdfdSamples;
        do {
          if (((poVar13->
               super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
               ._M_engaged == true) &&
             (lVar4 = *(long *)&(poVar13->
                                super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                ._M_impl,
             _Var15._M_p <
             (pointer)((long)*(pointer *)
                              ((long)&(poVar13->
                                      super__Optional_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>_>
                                      ._M_payload._M_value.
                                      super__Vector_base<ktx::SampleType,_std::allocator<ktx::SampleType>_>
                                      ._M_impl + 8) - lVar4 >> 4))) {
            puVar1 = (undefined8 *)(lVar4 + (long)_Var15._M_p * 0x10);
            uVar3 = puVar1[1];
            *(undefined8 *)((long)&local_198 + lVar9) = *puVar1;
            *(undefined8 *)((long)samples + lVar9 + -8) = uVar3;
            if (*(char *)((long)&samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload
                         + lVar9) == '\0') {
              *(undefined1 *)
               ((long)&samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                       super__Optional_payload_base<ktx::SampleType>._M_payload + lVar9) = 1;
            }
          }
          lVar9 = lVar9 + 0x14;
          poVar13 = poVar13 + 1;
        } while (lVar9 == 0x24);
        lVar9 = 4;
        do {
          *(undefined1 *)
           ((long)&qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload + lVar9) = 0;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x14);
        pbVar11 = &samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::SampleType>._M_engaged;
        lVar9 = 0;
        do {
          if (*pbVar11 == true) {
            qualifierFlags[lVar9].super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int> =
                 (_Optional_payload_base<unsigned_int>)
                 ((ulong)(pbVar11[-0xd] & 0xfffffff0) | 0x100000000);
          }
          lVar9 = lVar9 + 1;
          pbVar11 = pbVar11 + 0x14;
        } while (lVar9 == 1);
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
        fmt_06.size_ = 0x42;
        fmt_06.data_ = (char *)0x35;
        args_06.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pcVar20;
        args_06.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var15._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_1a8,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers",fmt_06,args_06);
        local_f8._24_8_ = CONCAT44(uStack_19c,_local_1a0);
        local_f8._8_8_ = 0xe;
        local_f8._16_8_ = "    Qualifiers";
        local_f8._32_8_ = _local_1a8;
        lVar9 = 0x2c;
        do {
          local_f8[lVar9] = 0;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x3c);
        local_f8[0x38] =
             qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged !=
             qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged;
        if (qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == true && !(bool)local_f8[0x38])
        {
          local_f8[0x38] =
               qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload._M_value !=
               qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload._M_value;
        }
        local_f8[0x2c] =
             qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged;
        local_f8._45_3_ =
             qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._5_3_;
        local_f8._40_4_ =
             qualifierFlags[0].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload._M_value;
        local_f8[0x34] =
             qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged;
        local_f8._53_3_ =
             qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._5_3_;
        local_f8._48_4_ =
             qualifierFlags[1].super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload._M_value;
        local_f8._0_8_ = &PTR_value_abi_cxx11__0025eaa8;
        local_b8 = dfdToStringSampleDatatypeQualifiersBit;
        PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_1a8 != &local_198) {
          operator_delete((void *)_local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
        fmt_07.size_ = 0x42;
        fmt_07.data_ = (char *)0x36;
        args_07.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pcVar20;
        args_07.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var15._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_1a8,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/channelType",fmt_07,args_07);
        jsonPathIn_04._M_len._4_4_ = uStack_19c;
        jsonPathIn_04._M_len._0_4_ = _local_1a0;
        if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          local_9c._0_4_ =
               (byte)samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ & 0xf;
          local_9c[4] = 1;
        }
        else {
          local_9c._4_4_ = (uint)(uint3)local_9c._5_3_ << 8;
        }
        local_5c = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        if ((bool)local_5c) {
          local_60._M_value =
               (byte)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._3_1_ & 0xf;
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._0_8_ = &bdfds_local;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._8_8_ = samples;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_8_ =
             std::
             _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1745:13)>
             ::_M_invoke;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ =
             std::
             _Function_handler<const_char_*(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_compare.cpp:1745:13)>
             ::_M_manager;
        aVar17.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_9c;
        textHeaderIn_04._M_str = "    Channel Type";
        textHeaderIn_04._M_len = 0x10;
        jsonPathIn_04._M_str = (char *)_local_1a8;
        DiffEnum<_khr_df_model_channels_e>::DiffEnum
                  ((DiffEnum<_khr_df_model_channels_e> *)local_f8,textHeaderIn_04,jsonPathIn_04,
                   (optional<int> *)aVar17.values_,(optional<int> *)&local_60,
                   (function<const_char_*(unsigned_long)> *)lengthAndOffset);
        local_f8[0x39] = true;
        PrintDiff::operator<<(diff,(DiffBase<_khr_df_model_channels_e> *)local_f8);
        if (lengthAndOffset[0].
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ != 0) {
          (*(code *)lengthAndOffset[0].
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_)(lengthAndOffset,lengthAndOffset,3);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_1a8 != &local_198) {
          operator_delete((void *)_local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        if ((local_88->options).super_OptionsFormat.format == text) {
          lVar9 = 0x20;
          do {
            *(undefined1 *)
             ((long)&lengthAndOffset[0].
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + lVar9) = 0;
            lVar9 = lVar9 + 0x28;
          } while (lVar9 != 0x70);
          lVar9 = -0x14;
          this_00 = (optional<std::__cxx11::string> *)lengthAndOffset;
          do {
            if ((&samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                  super__Optional_payload_base<ktx::SampleType>._M_engaged)[lVar9] == true) {
              uVar5 = *(ulong *)((long)&samples[1].super__Optional_base<ktx::SampleType,_true,_true>
                                        ._M_payload.super__Optional_payload_base<ktx::SampleType>.
                                        _M_payload + lVar9);
              local_f8._16_8_ = uVar5 & 0xffff;
              local_f8._0_8_ = (uVar5 >> 0x10 & 0xff) + 1;
              fmt_10.size_ = 0x22;
              fmt_10.data_ = (char *)0x1e;
              args_10.field_1.values_ = aVar17.values_;
              args_10.desc_ = (unsigned_long_long)local_f8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&local_1a8,(v10 *)"    Length: {} bits Offset: {}",fmt_10,args_10
                        );
              std::optional<std::__cxx11::string>::operator=
                        (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_local_1a8 != &local_198) {
                operator_delete((void *)_local_1a8,
                                CONCAT71(local_198._M_allocated_capacity._1_7_,
                                         local_198._M_local_buf[0]) + 1);
              }
            }
            this_00 = this_00 + 0x28;
            lVar9 = lVar9 + 0x14;
          } while (lVar9 == 0);
          DiffTextCustom::DiffTextCustom
                    ((DiffTextCustom *)local_f8,lengthAndOffset,lengthAndOffset + 1);
          PrintDiff::operator<<(diff,(DiffTextCustom *)local_f8);
          lVar9 = 0x50;
          do {
            if (*(char *)((long)&local_100._M_p + lVar9) == '\x01') {
              pbVar11 = &lengthAndOffset[1].
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_engaged + lVar9;
              *(undefined1 *)((long)&local_100._M_p + lVar9) = 0;
              plVar6 = *(long **)((long)&lengthAndOffset[1].
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._M_payload + lVar9 + 0x10);
              if (pbVar11 != (bool *)plVar6) {
                operator_delete(plVar6,*(long *)pbVar11 + 1);
              }
            }
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != 0);
          lVar9 = 0;
          do {
            if ((&lengthAndOffset[1].
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged)[lVar9] == true) {
              (&lengthAndOffset[1].
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged)[lVar9] = false;
              pvVar7 = *(void **)((long)&lengthAndOffset[1].
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._M_payload + lVar9);
              if ((void *)((long)&lengthAndOffset[1].
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + lVar9 + 0x10) != pvVar7) {
                operator_delete(pvVar7,*(long *)((long)&lengthAndOffset[1].
                                                                                                                
                                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                  ._M_payload.
                                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                  .
                                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ._M_payload + lVar9 + 0x10) + 1);
              }
            }
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != -0x50);
        }
        else {
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_08.size_ = 0x42;
          fmt_08.data_ = (char *)0x34;
          args_08.field_1.values_ = aVar17.values_;
          args_08.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var15._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/bitLength",fmt_08,args_08);
          local_f8._24_8_ = CONCAT44(uStack_19c,_local_1a0);
          aVar17.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)(local_f8 + 8);
          local_f8._8_8_ = 0;
          local_f8._16_8_ = (char *)0x0;
          local_f8._32_8_ = _local_1a8;
          lVar9 = 0x2c;
          do {
            local_f8[lVar9] = 0;
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x3c);
          if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
            local_70 = (uint)(byte)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                   _M_payload._2_1_;
          }
          if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
            local_74 = (uint)(byte)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                   _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                   _M_payload._2_1_;
          }
          local_f8[0x38] =
               local_70 != local_74 &
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged |
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged !=
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_f8[0x2c] =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_f8._40_4_ = local_70;
          local_f8._45_3_ = 0;
          local_f8[0x34] =
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_f8._48_4_ = local_74;
          local_f8._53_3_ = 0;
          local_f8._0_8_ = &PTR_value_abi_cxx11__0025f2f0;
          PrintDiff::operator<<(diff,(DiffBase<int> *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_local_1a8 != &local_198) {
            operator_delete((void *)_local_1a8,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
          fmt_09.size_ = 0x42;
          fmt_09.data_ = (char *)0x34;
          args_09.field_1.values_ = aVar17.values_;
          args_09.desc_ = (unsigned_long_long)lengthAndOffset;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ = _Var15._M_p;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_1a8,
                     (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset",fmt_09,args_09);
          local_f8._24_8_ = CONCAT44(uStack_19c,_local_1a0);
          aVar17.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)(local_f8 + 8);
          local_f8._8_8_ = 0;
          local_f8._16_8_ = (char *)0x0;
          local_f8._32_8_ = _local_1a8;
          lVar9 = 0x2c;
          do {
            local_f8[lVar9] = 0;
            lVar9 = lVar9 + 8;
          } while (lVar9 != 0x3c);
          if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
            local_78 = (uint)(ushort)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._0_2_;
          }
          if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
              super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
            local_7c = (uint)(ushort)samples[1].super__Optional_base<ktx::SampleType,_true,_true>.
                                     _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                     _M_payload._0_2_;
          }
          local_f8[0x38] =
               local_78 != local_7c &
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged |
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged !=
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_f8[0x2c] =
               samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_f8._40_4_ = local_78;
          local_f8._45_3_ = 0;
          local_f8[0x34] =
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_engaged;
          local_f8._48_4_ = local_7c;
          local_f8._53_3_ = 0;
          local_f8._0_8_ = &PTR_value_abi_cxx11__0025f2f0;
          PrintDiff::operator<<(diff,(DiffBase<int> *)local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_local_1a8 != &local_198) {
            operator_delete((void *)_local_1a8,
                            CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]
                                    ) + 1);
          }
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
        fmt_11.size_ = 0x42;
        fmt_11.data_ = (char *)0x39;
        args_11.field_1.values_ = aVar17.values_;
        args_11.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var15._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_1a8,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition",fmt_11,args_11
                  );
        jsonPathIn_05._M_len._4_4_ = uStack_19c;
        jsonPathIn_05._M_len._0_4_ = _local_1a0;
        if (samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged == true) {
          uVar14 = (uint)((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ktx::SampleType>._M_payload
                                 ._0_8_ >> 0x20);
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = CONCAT44(uVar14 >> 8,uVar14) & 0xff000000ff;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length._5_3_ = 0;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length._0_5_ =
               CONCAT14((char)((ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>.
                                      _M_payload.super__Optional_payload_base<ktx::SampleType>.
                                      _M_payload._0_8_ >> 0x38),
                        (uint)(ushort)((ulong)samples[0].
                                              super__Optional_base<ktx::SampleType,_true,_true>.
                                              _M_payload.
                                              super__Optional_payload_base<ktx::SampleType>.
                                              _M_payload._0_8_ >> 0x30)) & 0xff000000ff;
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_1_ = 1;
        }
        else {
          lengthAndOffset[0].
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._16_8_ =
               (ulong)(uint7)lengthAndOffset[0].
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._17_7_ << 8;
        }
        local_8c = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                   super__Optional_payload_base<ktx::SampleType>._M_engaged == true;
        if (local_8c) {
          local_9c._0_4_ =
               samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
               super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ & 0xff;
          local_9c._4_4_ =
               (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ >> 8 & 0xff;
          local_9c._8_4_ =
               (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ >> 0x10 & 0xff;
          local_9c._12_4_ =
               (uint)samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._4_4_ >> 0x18;
        }
        aVar17.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)lengthAndOffset;
        textHeaderIn_05._M_str = "    Position";
        textHeaderIn_05._M_len = 0xc;
        jsonPathIn_05._M_str = (char *)_local_1a8;
        DiffBase<std::array<unsigned_int,_4UL>_>::DiffBase
                  ((DiffBase<std::array<unsigned_int,_4UL>_> *)local_f8,textHeaderIn_05,
                   jsonPathIn_05,(optional<std::array<unsigned_int,_4UL>_> *)aVar17.values_,
                   (optional<std::array<unsigned_int,_4UL>_> *)local_9c);
        local_f8._0_8_ = &PTR_value_abi_cxx11__0025f450;
        PrintDiff::operator<<(diff,(DiffBase<std::array<unsigned_int,_4UL>_> *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_1a8 != &local_198) {
          operator_delete((void *)_local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
        fmt_12.size_ = 0x42;
        fmt_12.data_ = (char *)0x36;
        args_12.field_1.values_ = aVar17.values_;
        args_12.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var15._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_1a8,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower",fmt_12,args_12);
        local_f8._24_8_ = CONCAT44(uStack_19c,_local_1a0);
        local_f8._8_8_ = 9;
        pcVar20 = "    Lower";
        local_f8._16_8_ = "    Lower";
        local_f8._32_8_ = _local_1a8;
        lVar9 = 0x2c;
        do {
          local_f8[lVar9] = 0;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x3c);
        uVar3 = _Var21._M_p;
        if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
          uVar3 = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                  super__Optional_payload_base<ktx::SampleType>._M_payload._8_8_;
        }
        _Var21._M_p = (pointer)(uVar3 & 0xffffffff);
        if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
          local_64 = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.lower;
        }
        local_f8[0x38] =
             (uint32_t)uVar3 != local_64 &
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged |
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged !=
             samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged;
        local_f8._40_8_ =
             (ulong)_Var21._M_p |
             (ulong)samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                    super__Optional_payload_base<ktx::SampleType>._M_engaged << 0x20;
        local_f8[0x34] =
             samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged;
        local_f8._48_4_ = local_64;
        local_f8._53_3_ = 0;
        local_f8._0_8_ = &PTR_value_abi_cxx11__0025f558;
        PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_1a8 != &local_198) {
          operator_delete((void *)_local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = local_100._M_p;
        fmt_13.size_ = 0x42;
        fmt_13.data_ = (char *)0x36;
        args_13.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pcVar20;
        args_13.desc_ = (unsigned_long_long)lengthAndOffset;
        lengthAndOffset[0].
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._16_8_ = _Var15._M_p;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_1a8,
                   (v10 *)"/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper",fmt_13,args_13);
        local_f8._24_8_ = CONCAT44(uStack_19c,_local_1a0);
        local_f8._8_8_ = 9;
        pcVar20 = "    Upper";
        local_f8._16_8_ = "    Upper";
        local_f8._32_8_ = _local_1a8;
        lVar9 = 0x2c;
        do {
          local_f8[lVar9] = 0;
          lVar9 = lVar9 + 8;
        } while (lVar9 != 0x3c);
        if ((samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._16_4_ & 1) != 0) {
          local_6c = samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper;
        }
        if (samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
            super__Optional_payload_base<ktx::SampleType>._M_engaged != false) {
          local_68 = samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx::SampleType>._M_payload._M_value.upper;
        }
        local_f8[0x38] =
             local_6c != local_68 &
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged |
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged !=
             samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged;
        local_f8[0x2c] =
             samples[0].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged;
        local_f8._40_4_ = local_6c;
        local_f8._45_3_ = 0;
        local_f8[0x34] =
             samples[1].super__Optional_base<ktx::SampleType,_true,_true>._M_payload.
             super__Optional_payload_base<ktx::SampleType>._M_engaged;
        local_f8._48_4_ = local_68;
        local_f8._53_3_ = 0;
        local_f8._0_8_ = &PTR_value_abi_cxx11__0025f558;
        PrintDiff::operator<<(diff,(DiffBase<unsigned_int> *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_1a8 != &local_198) {
          operator_delete((void *)_local_1a8,
                          CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0])
                          + 1);
        }
        _Var15._M_p = _Var15._M_p + 1;
      } while (_Var15._M_p != pcVar12);
    }
  }
  return;
}

Assistant:

void CommandCompare::compareDFDBasic(PrintDiff& diff, uint32_t blockIndex,
    std::optional<BDFD> bdfds[2], std::optional<std::vector<SampleType>> bdfdSamples[2]) {
    for (std::size_t i = 0; i < 2; ++i)
        assert(bdfds[i].has_value() == bdfdSamples[i].has_value());

    if (options.ignoreDFD != IgnoreDFD::all_except_color_space)
        diff << DiffFlags("Flags",
            fmt::format("/dataFormatDescriptor/blocks/{}/flags", blockIndex),
            OPT_BITFIELDS(bdfds, flags), dfdToStringFlagsBit);

    diff << DiffEnum<khr_df_transfer_e>("Transfer",
        fmt::format("/dataFormatDescriptor/blocks/{}/transferFunction", blockIndex),
        OPT_BITFIELDS(bdfds, transfer),
        [&](auto i) { return dfdToStringTransferFunction(khr_df_transfer_e(bdfds[i]->transfer)); });
    diff << DiffEnum<khr_df_primaries_e>("Primaries",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorPrimaries", blockIndex),
        OPT_BITFIELDS(bdfds, primaries),
        [&](auto i) { return dfdToStringColorPrimaries(khr_df_primaries_e(bdfds[i]->primaries)); });

    // Do not compare the remainder of the BDFD if everything but color space information is ignored
    if (options.ignoreDFD == IgnoreDFD::all_except_color_space)
        return;

    diff << DiffEnum<khr_df_model_e>("Model",
        fmt::format("/dataFormatDescriptor/blocks/{}/colorModel", blockIndex),
        OPT_BITFIELDS(bdfds, model),
        [&](auto i) { return dfdToStringColorModel(khr_df_model_e(bdfds[i]->model)); });
    diff << DiffArray("Dimensions",
        fmt::format("/dataFormatDescriptor/blocks/{}/texelBlockDimension", blockIndex),
        OPT_UINT4S(bdfds, texelBlockDimension));

    if (!options.ignoreBDFDBytesPlane)
        diff << DiffArray("Plane bytes",
            fmt::format("/dataFormatDescriptor/blocks/{}/bytesPlane", blockIndex),
            OPT_FIELDS(bdfds, bytesPlanes));

    diff.addContext("Sample <i>:\n");

    std::size_t maxNumSamples = std::max(
        bdfdSamples[0].has_value() ? bdfdSamples[0]->size() : 0,
        bdfdSamples[1].has_value() ? bdfdSamples[1]->size() : 0
    );
    for (std::size_t sampleIndex = 0; sampleIndex < maxNumSamples; ++sampleIndex) {
        diff.updateContext(fmt::format("Sample {}:\n", sampleIndex));

        std::optional<SampleType> samples[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (bdfdSamples[i].has_value() && sampleIndex < bdfdSamples[i]->size())
                samples[i] = (*bdfdSamples[i])[sampleIndex];

        std::optional<uint32_t> qualifierFlags[2] = {};
        for (std::size_t i = 0; i < 2; ++i)
            if (samples[i].has_value()) {
                uint32_t flags = 0;
                flags |= samples[i]->qualifierLinear ? KHR_DF_SAMPLE_DATATYPE_LINEAR : 0;
                flags |= samples[i]->qualifierExponent ? KHR_DF_SAMPLE_DATATYPE_EXPONENT : 0;
                flags |= samples[i]->qualifierSigned ? KHR_DF_SAMPLE_DATATYPE_SIGNED : 0;
                flags |= samples[i]->qualifierFloat ? KHR_DF_SAMPLE_DATATYPE_FLOAT : 0;
                qualifierFlags[i] = flags;
            }
        diff << DiffFlags("    Qualifiers",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/qualifiers", blockIndex, sampleIndex),
            qualifierFlags[0], qualifierFlags[1], dfdToStringSampleDatatypeQualifiersBit);

        diff << DiffEnum<khr_df_model_channels_e>("    Channel Type",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/channelType", blockIndex, sampleIndex),
            OPT_BITFIELDS(samples, channelType),
            [&](auto i) {
                return dfdToStringChannelId(khr_df_model_e(bdfds[i]->model),
                    khr_df_model_channels_e(samples[i]->channelType));
            })
            .outputHexInText();

        // Text output combines length and offset so we have to special-case here
        if (options.format == OutputFormat::text) {
            std::optional<std::string> lengthAndOffset[2] = {};
            for (std::size_t i = 0; i < 2; ++i)
                if (samples[i].has_value())
                    lengthAndOffset[i] = fmt::format("    Length: {} bits Offset: {}",
                        static_cast<uint32_t>(samples[i]->bitLength + 1),
                        static_cast<uint32_t>(samples[i]->bitOffset));
            diff << DiffTextCustom(lengthAndOffset[0], lengthAndOffset[1]);
        } else {
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitLength", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitLength));
            diff << Diff({},
                fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/bitOffset", blockIndex, sampleIndex),
                OPT_BITFIELDS(samples, bitOffset));
        }

        diff << DiffArray("    Position",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/samplePosition", blockIndex, sampleIndex),
            OPT_UINT4S(samples, samplePosition));
        diff << DiffHexFixedWidth("    Lower",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleLower", blockIndex, sampleIndex),
            OPT_FIELDS(samples, lower));
        diff << DiffHexFixedWidth("    Upper",
            fmt::format("/dataFormatDescriptor/blocks/{}/samples/{}/sampleUpper", blockIndex, sampleIndex),
            OPT_FIELDS(samples, upper));
    }
}